

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# valid.c
# Opt level: O0

void xmlDumpElementDecl(xmlBufferPtr buf,xmlElementPtr elem)

{
  uint uVar1;
  xmlElementPtr elem_local;
  xmlBufferPtr buf_local;
  
  if ((buf != (xmlBufferPtr)0x0) && (elem != (xmlElementPtr)0x0)) {
    uVar1 = elem->etype - XML_ELEMENT_TYPE_EMPTY;
    if (uVar1 < 3 || elem->etype == XML_ELEMENT_TYPE_ELEMENT) {
      switch((long)&switchD_001da52d::switchdataD_00287c80 +
             (long)(int)(&switchD_001da52d::switchdataD_00287c80)[uVar1]) {
      case 0x1da52f:
        xmlBufferWriteChar(buf,"<!ELEMENT ");
        if (elem->prefix != (xmlChar *)0x0) {
          xmlBufferWriteCHAR(buf,elem->prefix);
          xmlBufferWriteChar(buf,":");
        }
        xmlBufferWriteCHAR(buf,elem->name);
        xmlBufferWriteChar(buf," EMPTY>\n");
        break;
      case 0x1da591:
        xmlBufferWriteChar(buf,"<!ELEMENT ");
        if (elem->prefix != (xmlChar *)0x0) {
          xmlBufferWriteCHAR(buf,elem->prefix);
          xmlBufferWriteChar(buf,":");
        }
        xmlBufferWriteCHAR(buf,elem->name);
        xmlBufferWriteChar(buf," ANY>\n");
        break;
      case 0x1da5f3:
        xmlBufferWriteChar(buf,"<!ELEMENT ");
        if (elem->prefix != (xmlChar *)0x0) {
          xmlBufferWriteCHAR(buf,elem->prefix);
          xmlBufferWriteChar(buf,":");
        }
        xmlBufferWriteCHAR(buf,elem->name);
        xmlBufferWriteChar(buf," ");
        xmlDumpElementContent(buf,elem->content);
        xmlBufferWriteChar(buf,">\n");
        break;
      case 0x1da676:
        xmlBufferWriteChar(buf,"<!ELEMENT ");
        if (elem->prefix != (xmlChar *)0x0) {
          xmlBufferWriteCHAR(buf,elem->prefix);
          xmlBufferWriteChar(buf,":");
        }
        xmlBufferWriteCHAR(buf,elem->name);
        xmlBufferWriteChar(buf," ");
        xmlDumpElementContent(buf,elem->content);
        xmlBufferWriteChar(buf,">\n");
      }
    }
    else {
      xmlErrValid((xmlValidCtxtPtr)0x0,XML_ERR_INTERNAL_ERROR,
                  "Internal: ELEMENT struct corrupted invalid type\n",(char *)0x0);
    }
  }
  return;
}

Assistant:

void
xmlDumpElementDecl(xmlBufferPtr buf, xmlElementPtr elem) {
    if ((buf == NULL) || (elem == NULL))
        return;
    switch (elem->etype) {
	case XML_ELEMENT_TYPE_EMPTY:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " EMPTY>\n");
	    break;
	case XML_ELEMENT_TYPE_ANY:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " ANY>\n");
	    break;
	case XML_ELEMENT_TYPE_MIXED:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " ");
	    xmlDumpElementContent(buf, elem->content);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	case XML_ELEMENT_TYPE_ELEMENT:
	    xmlBufferWriteChar(buf, "<!ELEMENT ");
	    if (elem->prefix != NULL) {
		xmlBufferWriteCHAR(buf, elem->prefix);
		xmlBufferWriteChar(buf, ":");
	    }
	    xmlBufferWriteCHAR(buf, elem->name);
	    xmlBufferWriteChar(buf, " ");
	    xmlDumpElementContent(buf, elem->content);
	    xmlBufferWriteChar(buf, ">\n");
	    break;
	default:
	    xmlErrValid(NULL, XML_ERR_INTERNAL_ERROR,
		    "Internal: ELEMENT struct corrupted invalid type\n",
		    NULL);
    }
}